

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O3

bool duckdb::GreaterThan::Operation<float>(float *left,float *right)

{
  float input;
  float input_00;
  bool bVar1;
  bool bVar2;
  
  input = *left;
  input_00 = *right;
  bVar1 = Value::IsNan<float>(input);
  bVar2 = Value::IsNan<float>(input_00);
  return !bVar2 && (input_00 < input || bVar1);
}

Assistant:

bool GreaterThan::Operation(const float &left, const float &right) {
	return GreaterThanFloat<float>(left, right);
}